

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlIsRef(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  int iVar1;
  int iVar2;
  xmlAttributePtr pxVar3;
  
  iVar1 = 0;
  iVar2 = 0;
  if ((((attr != (xmlAttrPtr)0x0) &&
       ((doc != (xmlDocPtr)0x0 || (doc = attr->doc, iVar2 = 0, doc != (_xmlDoc *)0x0)))) &&
      ((iVar2 = iVar1, doc->intSubset != (xmlDtdPtr)0x0 || (doc->extSubset != (_xmlDtd *)0x0)))) &&
     ((elem != (xmlNodePtr)0x0 && (doc->type != XML_HTML_DOCUMENT_NODE)))) {
    pxVar3 = xmlGetDtdAttrDesc(doc->intSubset,elem->name,attr->name);
    if (pxVar3 == (xmlAttributePtr)0x0) {
      if (doc->extSubset == (xmlDtdPtr)0x0) {
        pxVar3 = (xmlAttributePtr)0x0;
      }
      else {
        pxVar3 = xmlGetDtdAttrDesc(doc->extSubset,elem->name,attr->name);
      }
    }
    if ((pxVar3 == (xmlAttributePtr)0x0) || (iVar2 = 1, 1 < pxVar3->atype - XML_ATTRIBUTE_IDREF)) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
xmlIsRef(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if (attr == NULL)
        return(0);
    if (doc == NULL) {
        doc = attr->doc;
	if (doc == NULL) return(0);
    }

    if ((doc->intSubset == NULL) && (doc->extSubset == NULL)) {
        return(0);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        /* TODO @@@ */
        return(0);
    } else {
        xmlAttributePtr attrDecl;

        if (elem == NULL) return(0);
        attrDecl = xmlGetDtdAttrDesc(doc->intSubset, elem->name, attr->name);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdAttrDesc(doc->extSubset,
		                         elem->name, attr->name);

	if ((attrDecl != NULL) &&
	    (attrDecl->atype == XML_ATTRIBUTE_IDREF ||
	     attrDecl->atype == XML_ATTRIBUTE_IDREFS))
	return(1);
    }
    return(0);
}